

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.h
# Opt level: O0

void HeavyChange_Test_Hitter<8u>(string *PATH)

{
  bool bVar1;
  int iVar2;
  value_type pbVar3;
  reference ppbVar4;
  unordered_map<Data<8U>,_int,_My_Hash<8U>,_std::equal_to<Data<8U>_>,_std::allocator<std::pair<const_Data<8U>,_int>_>_>
  *this;
  unordered_map<Data<8U>,_int,_My_Hash<8U>,_std::equal_to<Data<8U>_>,_std::allocator<std::pair<const_Data<8U>,_int>_>_>
  *this_00;
  void *pvVar5;
  LdSketchWrapper<8U> *pLVar6;
  ostream *poVar7;
  mapped_type *pmVar8;
  reference ppbVar9;
  undefined8 uVar10;
  undefined8 extraout_RDX;
  double dVar11;
  LdSketchWrapper<8U> *in_stack_fffffffffffff9b8;
  LdSketchWrapper<8U> *in_stack_fffffffffffff9c0;
  uint32_t _HASH_NUM;
  int in_stack_fffffffffffff9e8;
  int in_stack_fffffffffffff9ec;
  WavingSketch<8U,_16U,_8U> *in_stack_fffffffffffff9f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff9f8;
  undefined4 in_stack_fffffffffffffa00;
  int in_stack_fffffffffffffa04;
  size_type in_stack_fffffffffffffa08;
  long *plVar12;
  undefined4 in_stack_fffffffffffffa10;
  undefined4 in_stack_fffffffffffffa14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa18;
  int *in_stack_fffffffffffffa50;
  uchar in_stack_fffffffffffffa58 [8];
  ostream *in_stack_fffffffffffffa60;
  basic_ostream<char,_std::char_traits<char>_> **out_3;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  *__range2_1;
  undefined1 local_4d0 [4];
  int j_4;
  ofstream out;
  undefined1 local_2d0 [56];
  int local_298;
  int local_294;
  int j_3;
  int j_2;
  _Node_iterator_base<std::pair<const_Data<8U>,_int>,_true> local_288;
  int local_27c;
  _Node_iterator_base<std::pair<const_Data<8U>,_int>,_true> _Stack_278;
  int j_1;
  _Node_iterator_base<std::pair<const_Data<8U>,_int>,_true> local_270;
  int local_268;
  int local_264;
  int local_260;
  int slot_packets;
  int num;
  int t;
  Data<8U> packet;
  Data<8U> *records;
  int record_count;
  basic_ostream<char,_std::char_traits<char>_> **out_2;
  iterator __end2;
  iterator __begin2;
  vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  *__range2;
  uint32_t j;
  basic_ostream<char,_std::char_traits<char>_> **out_1;
  iterator __end3;
  iterator __begin3;
  vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  *__range3;
  unsigned_long __vla_expr0;
  HashMap<8U> mp;
  int SKETCH_NUM;
  int memory;
  int i;
  string local_178 [32];
  string local_158 [39];
  undefined1 local_131;
  string local_130 [32];
  string local_110 [32];
  string local_f0 [39];
  undefined1 local_c9;
  string local_c8 [32];
  string local_a8 [32];
  string local_88 [39];
  allocator local_61;
  string local_60 [8];
  string file;
  undefined1 local_28 [8];
  vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  outs;
  string *PATH_local;
  
  outs.
  super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)PATH;
  std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>::allocator
            ((allocator<std::basic_ostream<char,_std::char_traits<char>_>_*> *)0x10d956);
  std::
  vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  ::vector((vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
            *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10),
           in_stack_fffffffffffffa08,
           (allocator_type *)CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00));
  std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>::~allocator
            ((allocator<std::basic_ostream<char,_std::char_traits<char>_>_*> *)0x10d976);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"caida",&local_61);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  pbVar3 = (value_type)operator_new(0x200);
  local_c9 = 1;
  std::operator+(in_stack_fffffffffffffa18,
                 (char *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10));
  std::operator+(in_stack_fffffffffffff9f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff9f0);
  std::operator+(in_stack_fffffffffffff9f8,(char *)in_stack_fffffffffffff9f0);
  std::ofstream::ofstream(pbVar3,local_88,0x10);
  local_c9 = 0;
  ppbVar4 = std::
            vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
            ::operator[]((vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                          *)local_28,0);
  *ppbVar4 = pbVar3;
  std::__cxx11::string::~string(local_88);
  std::__cxx11::string::~string(local_a8);
  std::__cxx11::string::~string(local_c8);
  pbVar3 = (value_type)operator_new(0x200);
  local_131 = 1;
  std::operator+(in_stack_fffffffffffffa18,
                 (char *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10));
  std::operator+(in_stack_fffffffffffff9f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff9f0);
  std::operator+(in_stack_fffffffffffff9f8,(char *)in_stack_fffffffffffff9f0);
  std::ofstream::ofstream(pbVar3,local_f0,0x10);
  local_131 = 0;
  ppbVar4 = std::
            vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
            ::operator[]((vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                          *)local_28,1);
  *ppbVar4 = pbVar3;
  std::__cxx11::string::~string(local_f0);
  std::__cxx11::string::~string(local_110);
  std::__cxx11::string::~string(local_130);
  pbVar3 = (value_type)operator_new(0x200);
  std::operator+(in_stack_fffffffffffffa18,
                 (char *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10));
  std::operator+(in_stack_fffffffffffff9f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff9f0);
  std::operator+(in_stack_fffffffffffff9f8,(char *)in_stack_fffffffffffff9f0);
  std::ofstream::ofstream(pbVar3,local_158,0x10);
  ppbVar4 = std::
            vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
            ::operator[]((vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                          *)local_28,2);
  *ppbVar4 = pbVar3;
  std::__cxx11::string::~string(local_158);
  std::__cxx11::string::~string(local_178);
  std::__cxx11::string::~string((string *)&i);
  for (SKETCH_NUM = 0; SKETCH_NUM < 5; SKETCH_NUM = SKETCH_NUM + 1) {
    iVar2 = SKETCH_NUM * 500000 + 2000000;
    printf("\x1b[0m\x1b[1;4;36m> Memory size: %dKB\n\x1b[0m",(ulong)(uint)(iVar2 / 1000));
    _HASH_NUM = 0;
    std::
    unordered_map<Data<8U>,_int,_My_Hash<8U>,_std::equal_to<Data<8U>_>,_std::allocator<std::pair<const_Data<8U>,_int>_>_>
    ::unordered_map((unordered_map<Data<8U>,_int,_My_Hash<8U>,_std::equal_to<Data<8U>_>,_std::allocator<std::pair<const_Data<8U>,_int>_>_>
                     *)0x10dc7e);
    this = (unordered_map<Data<8U>,_int,_My_Hash<8U>,_std::equal_to<Data<8U>_>,_std::allocator<std::pair<const_Data<8U>,_int>_>_>
            *)operator_new(0x90);
    FR<8U>::FR((FR<8U> *)in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec,
               in_stack_fffffffffffff9e8);
    this_00 = (unordered_map<Data<8U>,_int,_My_Hash<8U>,_std::equal_to<Data<8U>_>,_std::allocator<std::pair<const_Data<8U>,_int>_>_>
               *)operator_new(0x98);
    FR_CF<8U>::FR_CF((FR_CF<8U> *)in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec,
                     in_stack_fffffffffffff9e8);
    operator_new(0xa8);
    WavingSketch<8U,_1U,_8U>::WavingSketch
              ((WavingSketch<8U,_1U,_8U> *)in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec,
               in_stack_fffffffffffff9e8,_HASH_NUM);
    pvVar5 = operator_new(0xa8);
    WavingSketch<8U,_16U,_8U>::WavingSketch
              (in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8,
               _HASH_NUM);
    pLVar6 = (LdSketchWrapper<8U> *)operator_new(0x88);
    LdSketchWrapper<8U>::LdSketchWrapper
              (in_stack_fffffffffffff9c0,(uint32_t)((ulong)in_stack_fffffffffffff9b8 >> 0x20),
               (int)in_stack_fffffffffffff9b8);
    in_stack_fffffffffffff9c0 = (LdSketchWrapper<8U> *)operator_new(0x90);
    FR<8U>::FR((FR<8U> *)in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec,
               in_stack_fffffffffffff9e8);
    operator_new(0x98);
    FR_CF<8U>::FR_CF((FR_CF<8U> *)in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec,
                     in_stack_fffffffffffff9e8);
    operator_new(0xa8);
    WavingSketch<8U,_1U,_8U>::WavingSketch
              ((WavingSketch<8U,_1U,_8U> *)in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec,
               in_stack_fffffffffffff9e8,_HASH_NUM);
    operator_new(0xa8);
    WavingSketch<8U,_16U,_8U>::WavingSketch
              (in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8,
               _HASH_NUM);
    operator_new(0x88);
    LdSketchWrapper<8U>::LdSketchWrapper
              (in_stack_fffffffffffff9c0,(uint32_t)((ulong)pLVar6 >> 0x20),(int)pLVar6);
    in_stack_fffffffffffff9b8 = pLVar6;
    if (SKETCH_NUM == 0) {
      __end3 = std::
               vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
               ::begin((vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                        *)this);
      std::
      vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
      ::end((vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
             *)this);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<std::basic_ostream<char,_std::char_traits<char>_>_**,_std::vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>_>
                                 *)this_00,
                                (__normal_iterator<std::basic_ostream<char,_std::char_traits<char>_>_**,_std::vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>_>
                                 *)this), in_stack_fffffffffffff9b8 = pLVar6, bVar1) {
        ppbVar9 = __gnu_cxx::
                  __normal_iterator<std::basic_ostream<char,_std::char_traits<char>_>_**,_std::vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>_>
                  ::operator*(&__end3);
        poVar7 = std::operator<<((ostream *)*ppbVar9,"MEM(KB)");
        std::operator<<(poVar7,",");
        for (__range2._4_4_ = 0; __range2._4_4_ < 5; __range2._4_4_ = __range2._4_4_ + 1) {
          poVar7 = std::operator<<((ostream *)*ppbVar9,
                                   (string *)
                                   (*(long *)(&stack0xfffffffffffff998 + (ulong)__range2._4_4_ * 8)
                                   + 8));
          std::operator<<(poVar7,",");
        }
        std::ostream::operator<<((ostream *)*ppbVar9,std::endl<char,std::char_traits<char>>);
        __gnu_cxx::
        __normal_iterator<std::basic_ostream<char,_std::char_traits<char>_>_**,_std::vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>_>
        ::operator++(&__end3);
      }
    }
    __end2 = std::
             vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
             ::begin((vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                      *)this);
    std::
    vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
    ::end((vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
           *)this);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::basic_ostream<char,_std::char_traits<char>_>_**,_std::vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>_>
                               *)this_00,
                              (__normal_iterator<std::basic_ostream<char,_std::char_traits<char>_>_**,_std::vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>_>
                               *)this), bVar1) {
      ppbVar9 = __gnu_cxx::
                __normal_iterator<std::basic_ostream<char,_std::char_traits<char>_>_**,_std::vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>_>
                ::operator*(&__end2);
      in_stack_fffffffffffffa60 =
           (ostream *)std::ostream::operator<<((ostream *)*ppbVar9,iVar2 / 1000);
      std::operator<<(in_stack_fffffffffffffa60,",");
      __gnu_cxx::
      __normal_iterator<std::basic_ostream<char,_std::char_traits<char>_>_**,_std::vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>_>
      ::operator++(&__end2);
    }
    std::__cxx11::string::c_str();
    in_stack_fffffffffffffa58 =
         (uchar  [8])
         read_standard_data<8u>
                   ((char *)in_stack_fffffffffffffa60,in_stack_fffffffffffffa58._4_4_,
                    in_stack_fffffffffffffa50);
    packet.str[0] = in_stack_fffffffffffffa58[0];
    packet.str[1] = in_stack_fffffffffffffa58[1];
    packet.str[2] = in_stack_fffffffffffffa58[2];
    packet.str[3] = in_stack_fffffffffffffa58[3];
    packet.str[4] = in_stack_fffffffffffffa58[4];
    packet.str[5] = in_stack_fffffffffffffa58[5];
    packet.str[6] = in_stack_fffffffffffffa58[6];
    packet.str[7] = in_stack_fffffffffffffa58[7];
    Data<8U>::Data((Data<8U> *)0x10e527);
    local_260 = 0;
    local_268 = records._4_4_ / 2;
    in_stack_fffffffffffffa50 = std::min<int>(&local_268,&MAX_PACKET);
    local_264 = *in_stack_fffffffffffffa50;
    while (local_260 < local_264) {
      Data<8U>::operator=((Data<8U> *)&num,(Data<8U> *)((long)packet.str + (long)local_260 * 8));
      local_270._M_cur =
           (__node_type *)
           std::
           unordered_map<Data<8U>,_int,_My_Hash<8U>,_std::equal_to<Data<8U>_>,_std::allocator<std::pair<const_Data<8U>,_int>_>_>
           ::find(this,(key_type *)0x10e5b8);
      _Stack_278._M_cur =
           (__node_type *)
           std::
           unordered_map<Data<8U>,_int,_My_Hash<8U>,_std::equal_to<Data<8U>_>,_std::allocator<std::pair<const_Data<8U>,_int>_>_>
           ::end(this);
      bVar1 = std::__detail::operator==(&local_270,&stack0xfffffffffffffd88);
      if (bVar1) {
        pmVar8 = std::
                 unordered_map<Data<8U>,_int,_My_Hash<8U>,_std::equal_to<Data<8U>_>,_std::allocator<std::pair<const_Data<8U>,_int>_>_>
                 ::operator[](this_00,(key_type *)this);
        *pmVar8 = 1;
      }
      else {
        pmVar8 = std::
                 unordered_map<Data<8U>,_int,_My_Hash<8U>,_std::equal_to<Data<8U>_>,_std::allocator<std::pair<const_Data<8U>,_int>_>_>
                 ::operator[](this_00,(key_type *)this);
        *pmVar8 = *pmVar8 + 1;
      }
      local_260 = local_260 + 1;
      for (local_27c = 0; local_27c < 5; local_27c = local_27c + 1) {
        (**(code **)**(undefined8 **)(&stack0xfffffffffffff998 + (long)local_27c * 8))
                  (*(undefined8 **)(&stack0xfffffffffffff998 + (long)local_27c * 8),&num,0);
      }
    }
    while (SBORROW4(local_260,local_264 * 2) != local_260 + local_264 * -2 < 0) {
      Data<8U>::operator=((Data<8U> *)&num,(Data<8U> *)((long)packet.str + (long)local_260 * 8));
      local_288._M_cur =
           (__node_type *)
           std::
           unordered_map<Data<8U>,_int,_My_Hash<8U>,_std::equal_to<Data<8U>_>,_std::allocator<std::pair<const_Data<8U>,_int>_>_>
           ::find(this,(key_type *)0x10e715);
      _j_3 = (__node_type *)
             std::
             unordered_map<Data<8U>,_int,_My_Hash<8U>,_std::equal_to<Data<8U>_>,_std::allocator<std::pair<const_Data<8U>,_int>_>_>
             ::end(this);
      bVar1 = std::__detail::operator==
                        (&local_288,
                         (_Node_iterator_base<std::pair<const_Data<8U>,_int>,_true> *)&j_3);
      if (bVar1) {
        pmVar8 = std::
                 unordered_map<Data<8U>,_int,_My_Hash<8U>,_std::equal_to<Data<8U>_>,_std::allocator<std::pair<const_Data<8U>,_int>_>_>
                 ::operator[](this_00,(key_type *)this);
        *pmVar8 = -1;
      }
      else {
        pmVar8 = std::
                 unordered_map<Data<8U>,_int,_My_Hash<8U>,_std::equal_to<Data<8U>_>,_std::allocator<std::pair<const_Data<8U>,_int>_>_>
                 ::operator[](this_00,(key_type *)this);
        *pmVar8 = *pmVar8 + -1;
      }
      local_260 = local_260 + 1;
      uVar10 = 0;
      for (local_294 = 5; local_294 < 10; local_294 = local_294 + 1) {
        (**(code **)**(undefined8 **)(&stack0xfffffffffffff998 + (long)local_294 * 8))
                  (*(undefined8 **)(&stack0xfffffffffffff998 + (long)local_294 * 8),&num,uVar10);
        uVar10 = extraout_RDX;
      }
    }
    free((void *)packet.str);
    for (local_298 = 0; local_298 < 5; local_298 = local_298 + 1) {
      plVar12 = *(long **)(&stack0xfffffffffffff998 + (long)local_298 * 8);
      std::
      unordered_map<Data<8U>,_int,_My_Hash<8U>,_std::equal_to<Data<8U>_>,_std::allocator<std::pair<const_Data<8U>,_int>_>_>
      ::unordered_map(this_00,this);
      (**(code **)(*plVar12 + 0x20))
                (plVar12,local_2d0,
                 *(undefined8 *)(&stack0xfffffffffffff998 + (long)(local_298 + 5) * 8),local_28);
      std::
      unordered_map<Data<8U>,_int,_My_Hash<8U>,_std::equal_to<Data<8U>_>,_std::allocator<std::pair<const_Data<8U>,_int>_>_>
      ::~unordered_map((unordered_map<Data<8U>,_int,_My_Hash<8U>,_std::equal_to<Data<8U>_>,_std::allocator<std::pair<const_Data<8U>,_int>_>_>
                        *)0x10e8d5);
    }
    std::ofstream::ofstream(local_4d0);
    for (__range2_1._4_4_ = 0; __range2_1._4_4_ < 5; __range2_1._4_4_ = __range2_1._4_4_ + 1) {
      printf("\x1b[0m\x1b[1;36m|\x1b[0m\t");
      Abstract<8U>::print_f1
                (&in_stack_fffffffffffff9c0->super_Abstract<8U>,
                 (ofstream *)in_stack_fffffffffffff9b8,(int)((ulong)pvVar5 >> 0x20));
    }
    dVar11 = LdSketchWrapper<8U>::average_l(in_stack_fffffffffffff9b8);
    printf("After average l first half: %lf\n",dVar11);
    in_stack_fffffffffffff9f0 =
         (WavingSketch<8U,_16U,_8U> *)LdSketchWrapper<8U>::average_l(in_stack_fffffffffffff9b8);
    printf("After average l second half: %lf\n",in_stack_fffffffffffff9f0);
    __end2_1 = std::
               vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
               ::begin((vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                        *)this);
    std::
    vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
    ::end((vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
           *)this);
    in_stack_fffffffffffffa04 = __range2_1._4_4_;
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::basic_ostream<char,_std::char_traits<char>_>_**,_std::vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>_>
                               *)this_00,
                              (__normal_iterator<std::basic_ostream<char,_std::char_traits<char>_>_**,_std::vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>_>
                               *)this), bVar1) {
      ppbVar9 = __gnu_cxx::
                __normal_iterator<std::basic_ostream<char,_std::char_traits<char>_>_**,_std::vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>_>
                ::operator*(&__end2_1);
      std::ostream::operator<<((ostream *)*ppbVar9,std::endl<char,std::char_traits<char>>);
      __gnu_cxx::
      __normal_iterator<std::basic_ostream<char,_std::char_traits<char>_>_**,_std::vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>_>
      ::operator++(&__end2_1);
    }
    std::ofstream::~ofstream(local_4d0);
    std::
    unordered_map<Data<8U>,_int,_My_Hash<8U>,_std::equal_to<Data<8U>_>,_std::allocator<std::pair<const_Data<8U>,_int>_>_>
    ::~unordered_map((unordered_map<Data<8U>,_int,_My_Hash<8U>,_std::equal_to<Data<8U>_>,_std::allocator<std::pair<const_Data<8U>,_int>_>_>
                      *)0x10eab5);
  }
  std::__cxx11::string::~string(local_60);
  std::
  vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  ::~vector((vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
             *)CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00));
  return;
}

Assistant:

void HeavyChange_Test_Hitter(string PATH) {
	std::vector<std::ostream*> outs(3);
	std::string file = "caida";
	outs[0] = new std::ofstream(RESULT_FOLDER + "heavychange_" + file + "_Recall Rate (RR).csv");
	outs[1] = new std::ofstream(RESULT_FOLDER + "heavychange_" + file + "_Precision Rate (PR).csv");
	outs[2] = new std::ofstream(RESULT_FOLDER + "heavychange_" + file + "_F1.csv");
	for (int i = 0; i < 5; ++i) {
		int memory = 8 * HeavyChange_BLOCK + 2 * HeavyChange_BLOCK * i;
		printf("\033[0m\033[1;4;36m> Memory size: %dKB\n\033[0m", memory / 1000);
		int SKETCH_NUM = 10;
		auto mp = HashMap<DATA_LEN>();
		Abstract<DATA_LEN>* sketch[SKETCH_NUM];
		sketch[0] = new FR<DATA_LEN>(memory, HeavyChange_HIT);
		sketch[1] = new FR_CF<DATA_LEN>(memory, HeavyChange_HIT);
		sketch[2] = new WavingSketch<8, 1, DATA_LEN>(memory / 10, HeavyChange_HIT);
		sketch[3] = new WavingSketch<8, 16, DATA_LEN>(memory / 10, HeavyChange_HIT);
		sketch[4] = new LdSketchWrapper<DATA_LEN>(memory / 10, HeavyChange_HIT);
		sketch[5] = new FR<DATA_LEN>(memory, HeavyChange_HIT);
		sketch[6] = new FR_CF<DATA_LEN>(memory, HeavyChange_HIT);
		sketch[7] = new WavingSketch<8, 1, DATA_LEN>(memory / 10, HeavyChange_HIT);
		sketch[8] = new WavingSketch<8, 16, DATA_LEN>(memory / 10, HeavyChange_HIT);
		sketch[9] = new LdSketchWrapper<DATA_LEN>(memory / 10, HeavyChange_HIT);

		if (i == 0)
		{
			for (auto& out : outs)
			{
				*out << "MEM(KB)" << ",";
				for (uint32_t j = 0; j < SKETCH_NUM / 2; j++)
				{
					*out << sketch[j]->name << ",";
				}
				*out << std::endl;
			}
		}
		for (auto& out : outs)
		{
			*out << memory / 1000 << ",";
		}

		int record_count;
		auto records =
			read_standard_data<DATA_LEN>(PATH.c_str(), record_length, &record_count);
		Data<DATA_LEN> packet;
		int t;
		int num = 0;
		int slot_packets = std::min(record_count / 2, MAX_PACKET);
		while (num < slot_packets) {
			packet = records[num];
			if (mp.find(packet) == mp.end())
				mp[packet] = 1;
			else
				mp[packet] += 1;
			num++;

			for (int j = 0; j < SKETCH_NUM / 2; ++j) {
				sketch[j]->Init(packet);
			}
		}

		while (num < 2 * slot_packets) {
			packet = records[num];
			if (mp.find(packet) == mp.end())
				mp[packet] = -1;
			else
				mp[packet] -= 1;
			num++;

			for (int j = SKETCH_NUM / 2; j < SKETCH_NUM; ++j) {
				sketch[j]->Init(packet);
			}
		}

		free(records);

		for (int j = 0; j < SKETCH_NUM / 2; ++j) {
			sketch[j]->Check(mp, sketch[j + (SKETCH_NUM / 2)], outs);
		}

		ofstream out;
		for (int j = 0; j < SKETCH_NUM / 2; ++j) {
			printf("\033[0m\033[1;36m|\033[0m\t");
			sketch[j]->print_f1(out, memory);
		}

		printf("After average l first half: %lf\n",
			((LdSketchWrapper<DATA_LEN>*)sketch[4])->average_l());
		printf("After average l second half: %lf\n",
			((LdSketchWrapper<DATA_LEN>*)sketch[4])->average_l());
		for (auto& out : outs)
		{
			*out << std::endl;
		}
	}
}